

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

UniValue *
AddrmanTableToJSON(UniValue *__return_storage_ptr__,
                  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
                  *tableInfos,CConnman *connman)

{
  int iVar1;
  int iVar2;
  string key_00;
  UniValue val;
  ostream *this;
  pointer other;
  long in_FS_OFFSET;
  ostringstream key;
  AddrInfo info;
  undefined8 in_stack_fffffffffffffd18;
  pointer ppVar3;
  undefined8 in_stack_fffffffffffffd38;
  _Alloc_hider in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd58 [56];
  long *local_270;
  long local_260 [2];
  ostringstream local_250 [112];
  ios_base local_1e0 [264];
  direct_or_indirect local_d8;
  uint local_c8;
  undefined8 local_c0;
  uint16_t local_b8;
  rep local_b0;
  ServiceFlags SStack_a8;
  rep local_a0;
  rep rStack_98;
  direct_or_indirect local_90;
  uint local_80;
  undefined8 local_78;
  rep local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  other = (tableInfos->
          super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (tableInfos->
           super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (other != ppVar3) {
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)other);
      local_c0._0_4_ = (other->first).super_CAddress.super_CService.super_CNetAddr.m_net;
      local_c0._4_4_ = (other->first).super_CAddress.super_CService.super_CNetAddr.m_scope_id;
      local_b8 = (other->first).super_CAddress.super_CService.port;
      local_b0 = (other->first).super_CAddress.nTime.__d.__r;
      SStack_a8 = (other->first).super_CAddress.nServices;
      local_a0 = (other->first).m_last_try.__d.__r;
      rStack_98 = (other->first).m_last_count_attempt.__d.__r;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90.indirect_contents,
                 &(other->first).source.m_addr);
      local_78._0_4_ = (other->first).source.m_net;
      local_78._4_4_ = (other->first).source.m_scope_id;
      local_60._0_1_ = (other->first).fInTried;
      local_60._1_3_ = *(undefined3 *)&(other->first).field_0x79;
      local_60._4_4_ = (other->first).nRandomPos;
      local_70 = (other->first).m_last_success.__d.__r;
      uStack_68._0_4_ = (other->first).nAttempts;
      uStack_68._4_4_ = (other->first).nRefCount;
      iVar1 = (other->second).bucket;
      iVar2 = (other->second).position;
      std::__cxx11::ostringstream::ostringstream(local_250);
      this = (ostream *)std::ostream::operator<<((ostream *)local_250,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(this,"/",1);
      std::ostream::operator<<((ostream *)this,iVar2);
      std::__cxx11::stringbuf::str();
      AddrmanEntryToJSON((UniValue *)&stack0xfffffffffffffd38,
                         (AddrInfo *)&local_d8.indirect_contents,connman);
      key_00._M_string_length = (size_type)__return_storage_ptr__;
      key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
      key_00.field_2._M_allocated_capacity = (size_type)ppVar3;
      key_00.field_2._8_8_ = connman;
      val.val._M_dataplus._M_p = in_stack_fffffffffffffd40._M_p;
      val.typ = (VType)in_stack_fffffffffffffd38;
      val._4_4_ = SUB84(in_stack_fffffffffffffd38,4);
      val.val._M_string_length = in_stack_fffffffffffffd48;
      val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd50;
      val._32_56_ = in_stack_fffffffffffffd58;
      UniValue::pushKVEnd(__return_storage_ptr__,key_00,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffd78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffd60);
      if (in_stack_fffffffffffffd40._M_p != &stack0xfffffffffffffd50) {
        operator_delete(in_stack_fffffffffffffd40._M_p,in_stack_fffffffffffffd50 + 1);
      }
      if (local_270 != local_260) {
        operator_delete(local_270,local_260[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_250);
      std::ios_base::~ios_base(local_1e0);
      if (0x10 < local_80) {
        free(local_90.indirect_contents.indirect);
        local_90.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_c8) {
        free(local_d8.indirect_contents.indirect);
        local_d8.indirect_contents.indirect = (char *)0x0;
      }
      other = other + 1;
    } while (other != ppVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue AddrmanTableToJSON(const std::vector<std::pair<AddrInfo, AddressPosition>>& tableInfos, CConnman& connman)
{
    UniValue table(UniValue::VOBJ);
    for (const auto& e : tableInfos) {
        AddrInfo info = e.first;
        AddressPosition location = e.second;
        std::ostringstream key;
        key << location.bucket << "/" << location.position;
        // Address manager tables have unique entries so there is no advantage
        // in using UniValue::pushKV, which checks if the key already exists
        // in O(N). UniValue::pushKVEnd is used instead which currently is O(1).
        table.pushKVEnd(key.str(), AddrmanEntryToJSON(info, connman));
    }
    return table;
}